

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoind.cpp
# Opt level: O0

bool AppInit(NodeContext *node)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  int iVar4;
  ArgsManager **ppAVar5;
  NodeContext *in_RDI;
  long in_FS_OFFSET;
  exception *e;
  int token;
  ArgsManager *args;
  bool fRet;
  any context;
  TokenPipeEnd daemon_ep;
  ArgsManager *in_stack_00000168;
  ArgsManager *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb4;
  undefined1 in_stack_fffffffffffffdb5;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 in_stack_fffffffffffffdb7;
  undefined4 in_stack_fffffffffffffdb8;
  uint in_stack_fffffffffffffdbc;
  TokenPipeEnd *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcc;
  undefined1 in_stack_fffffffffffffdcd;
  undefined1 in_stack_fffffffffffffdce;
  uint8_t in_stack_fffffffffffffdcf;
  ArgsManager *in_stack_fffffffffffffdd0;
  Context *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined2 in_stack_fffffffffffffde4;
  undefined1 in_stack_fffffffffffffde6;
  undefined1 in_stack_fffffffffffffde7;
  ArgsManager *in_stack_fffffffffffffde8;
  ArgsManager *args_00;
  allocator<char> *in_stack_fffffffffffffdf0;
  undefined6 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdfe;
  byte bVar6;
  undefined1 in_stack_fffffffffffffdff;
  ArgsManager *in_stack_fffffffffffffe00;
  bool local_171;
  allocator<char> local_14b;
  allocator<char> local_14a;
  allocator<char> local_149 [32];
  allocator<char> local_129 [289];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ppAVar5 = inline_assertion_check<true,ArgsManager*&>
                      ((ArgsManager **)in_stack_fffffffffffffde8,
                       (char *)CONCAT17(in_stack_fffffffffffffde7,
                                        CONCAT16(in_stack_fffffffffffffde6,
                                                 CONCAT24(in_stack_fffffffffffffde4,
                                                          in_stack_fffffffffffffde0))),
                       (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                       (char *)in_stack_fffffffffffffdd0,
                       (char *)CONCAT17(in_stack_fffffffffffffdcf,
                                        CONCAT16(in_stack_fffffffffffffdce,
                                                 CONCAT15(in_stack_fffffffffffffdcd,
                                                          CONCAT14(in_stack_fffffffffffffdcc,
                                                                   in_stack_fffffffffffffdc8)))));
  args_00 = *ppAVar5;
  TokenPipeEnd::TokenPipeEnd((TokenPipeEnd *)in_stack_fffffffffffffda8,0);
  std::any::
  any<node::NodeContext*,node::NodeContext*,std::any::_Manager_internal<node::NodeContext*>,void>
            ((any *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             (NodeContext **)
             CONCAT17(in_stack_fffffffffffffdb7,
                      CONCAT16(in_stack_fffffffffffffdb6,
                               CONCAT15(in_stack_fffffffffffffdb5,
                                        CONCAT14(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0
                                                )))));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdff,
                      CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8)),
             (char *)in_stack_fffffffffffffdf0,(allocator<char> *)in_stack_fffffffffffffde8);
  ArgsManager::SoftSetBoolArg
            (in_stack_fffffffffffffe00,
             (string *)
             CONCAT17(in_stack_fffffffffffffdff,
                      CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8)),
             SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffda8);
  std::allocator<char>::~allocator(local_129);
  InitLogging(in_stack_fffffffffffffda8);
  InitParameterInteraction(in_stack_00000168);
  bVar1 = AppInitBasicSetup(in_stack_fffffffffffffdd0,
                            (atomic<int> *)
                            CONCAT17(in_stack_fffffffffffffdcf,
                                     CONCAT16(in_stack_fffffffffffffdce,
                                              CONCAT15(in_stack_fffffffffffffdcd,
                                                       CONCAT14(in_stack_fffffffffffffdcc,
                                                                in_stack_fffffffffffffdc8)))));
  if (bVar1) {
    bVar1 = AppInitParameterInteraction(args_00);
    if (bVar1) {
      std::make_unique<node::Warnings>();
      std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::operator=
                ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
                 CONCAT17(in_stack_fffffffffffffdb7,
                          CONCAT16(in_stack_fffffffffffffdb6,
                                   CONCAT15(in_stack_fffffffffffffdb5,
                                            CONCAT14(in_stack_fffffffffffffdb4,
                                                     in_stack_fffffffffffffdb0)))));
      std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::~unique_ptr
                ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      std::make_unique<kernel::Context>();
      std::unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_>::operator=
                ((unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)
                 CONCAT17(in_stack_fffffffffffffdb7,
                          CONCAT16(in_stack_fffffffffffffdb6,
                                   CONCAT15(in_stack_fffffffffffffdb5,
                                            CONCAT14(in_stack_fffffffffffffdb4,
                                                     in_stack_fffffffffffffdb0)))));
      std::unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_>::~unique_ptr
                ((unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      std::make_unique<ECC_Context>();
      std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::operator=
                ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)
                 CONCAT17(in_stack_fffffffffffffdb7,
                          CONCAT16(in_stack_fffffffffffffdb6,
                                   CONCAT15(in_stack_fffffffffffffdb5,
                                            CONCAT14(in_stack_fffffffffffffdb4,
                                                     in_stack_fffffffffffffdb0)))));
      std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::~unique_ptr
                ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      std::unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_>::operator*
                ((unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      bVar1 = AppInitSanityChecks(in_stack_fffffffffffffdd8);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdff,
                            CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8)),
                   (char *)in_stack_fffffffffffffdf0,(allocator<char> *)in_stack_fffffffffffffde8);
        uVar2 = ArgsManager::GetBoolArg
                          ((ArgsManager *)
                           CONCAT17(in_stack_fffffffffffffdb7,
                                    CONCAT16(in_stack_fffffffffffffdb6,
                                             CONCAT15(in_stack_fffffffffffffdb5,
                                                      CONCAT14(in_stack_fffffffffffffdb4,
                                                               in_stack_fffffffffffffdb0)))),
                           (string *)in_stack_fffffffffffffda8,
                           SUB41(in_stack_fffffffffffffdbc >> 0x18,0));
        bVar6 = 1;
        bVar3 = bVar6;
        if (!(bool)uVar2) {
          in_stack_fffffffffffffdf0 = &local_14a;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,CONCAT16(bVar6,in_stack_fffffffffffffdf8)),
                     (char *)in_stack_fffffffffffffdf0,(allocator<char> *)args_00);
          bVar6 = ArgsManager::GetBoolArg
                            ((ArgsManager *)
                             CONCAT17(in_stack_fffffffffffffdb7,
                                      CONCAT16(in_stack_fffffffffffffdb6,
                                               CONCAT15(in_stack_fffffffffffffdb5,
                                                        CONCAT14(in_stack_fffffffffffffdb4,
                                                                 in_stack_fffffffffffffdb0)))),
                             (string *)in_stack_fffffffffffffda8,
                             SUB41(in_stack_fffffffffffffdbc >> 0x18,0));
          in_stack_fffffffffffffde7 = bVar6;
          bVar3 = bVar6;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8);
          std::allocator<char>::~allocator(&local_14a);
          in_stack_fffffffffffffde8 = args_00;
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffda8);
        std::allocator<char>::~allocator(local_149);
        if ((bVar6 & 1) != 0) {
          tinyformat::format<>
                    ((ostream *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     (char *)CONCAT17(in_stack_fffffffffffffdb7,
                                      CONCAT16(in_stack_fffffffffffffdb6,
                                               CONCAT15(in_stack_fffffffffffffdb5,
                                                        CONCAT14(in_stack_fffffffffffffdb4,
                                                                 in_stack_fffffffffffffdb0)))));
          iVar4 = fork_daemon(SUB81((ulong)in_stack_fffffffffffffde8 >> 0x38,0),
                              SUB81((ulong)in_stack_fffffffffffffde8 >> 0x30,0),
                              (TokenPipeEnd *)
                              CONCAT17(in_stack_fffffffffffffde7,
                                       CONCAT16(bVar6,CONCAT24(in_stack_fffffffffffffde4,
                                                               in_stack_fffffffffffffde0))));
          if (iVar4 == -1) {
            __errno_location();
            SysErrorString_abi_cxx11_
                      (CONCAT13(in_stack_fffffffffffffdcf,
                                CONCAT12(in_stack_fffffffffffffdce,
                                         CONCAT11(in_stack_fffffffffffffdcd,
                                                  in_stack_fffffffffffffdcc))));
            tinyformat::format<std::__cxx11::string>
                      ((char *)in_stack_fffffffffffffdd8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffdd0);
            Untranslated((string *)
                         CONCAT17(in_stack_fffffffffffffde7,
                                  CONCAT16(bVar6,CONCAT24(in_stack_fffffffffffffde4,iVar4))));
            local_171 = InitError((bilingual_str *)in_stack_fffffffffffffdd0);
            bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffda8);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffda8);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffda8);
            goto LAB_00173321;
          }
          if (iVar4 != 0) {
            iVar4 = TokenPipeEnd::TokenRead(in_stack_fffffffffffffdc0);
            if (iVar4 != 0) {
              exit(0);
            }
            tinyformat::format<>
                      ((ostream *)((ulong)in_stack_fffffffffffffdbc << 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffdb7,
                                        CONCAT16(in_stack_fffffffffffffdb6,
                                                 CONCAT15(in_stack_fffffffffffffdb5,
                                                          CONCAT14(in_stack_fffffffffffffdb4,
                                                                   in_stack_fffffffffffffdb0)))));
            exit(1);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffdf8)),
                     (char *)in_stack_fffffffffffffdf0,(allocator<char> *)in_stack_fffffffffffffde8)
          ;
          in_stack_fffffffffffffdcf =
               ArgsManager::GetBoolArg
                         ((ArgsManager *)
                          CONCAT17(in_stack_fffffffffffffdb7,
                                   CONCAT16(in_stack_fffffffffffffdb6,
                                            CONCAT15(in_stack_fffffffffffffdb5,
                                                     CONCAT14(in_stack_fffffffffffffdb4,
                                                              in_stack_fffffffffffffdb0)))),
                          (string *)in_stack_fffffffffffffda8,
                          SUB41(in_stack_fffffffffffffdbc >> 0x18,0));
          bVar3 = in_stack_fffffffffffffdcf ^ 0xff;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8);
          std::allocator<char>::~allocator(&local_14b);
          if ((bVar3 & 1) != 0) {
            TokenPipeEnd::TokenWrite(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdcf);
            TokenPipeEnd::Close((TokenPipeEnd *)in_stack_fffffffffffffda8);
          }
        }
        bVar1 = AppInitLockDataDirectory();
        if (bVar1) {
          bVar1 = AppInitInterfaces((NodeContext *)
                                    CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          local_171 = false;
          if (bVar1) {
            local_171 = AppInitMain(in_RDI,(BlockAndHeaderTipInfo *)0x0);
          }
          bVar1 = TokenPipeEnd::IsOpen((TokenPipeEnd *)in_stack_fffffffffffffda8);
          if (bVar1) {
            TokenPipeEnd::TokenWrite(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdcf);
            TokenPipeEnd::Close((TokenPipeEnd *)in_stack_fffffffffffffda8);
          }
        }
        else {
          local_171 = false;
        }
      }
      else {
        local_171 = false;
      }
    }
    else {
      local_171 = false;
    }
  }
  else {
    local_171 = false;
  }
LAB_00173321:
  std::any::~any((any *)in_stack_fffffffffffffda8);
  TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)in_stack_fffffffffffffda8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_171;
  }
  __stack_chk_fail();
}

Assistant:

static bool AppInit(NodeContext& node)
{
    bool fRet = false;
    ArgsManager& args = *Assert(node.args);

#if HAVE_DECL_FORK
    // Communication with parent after daemonizing. This is used for signalling in the following ways:
    // - a boolean token is sent when the initialization process (all the Init* functions) have finished to indicate
    // that the parent process can quit, and whether it was successful/unsuccessful.
    // - an unexpected shutdown of the child process creates an unexpected end of stream at the parent
    // end, which is interpreted as failure to start.
    TokenPipeEnd daemon_ep;
#endif
    std::any context{&node};
    try
    {
        // -server defaults to true for bitcoind but not for the GUI so do this here
        args.SoftSetBoolArg("-server", true);
        // Set this early so that parameter interactions go to console
        InitLogging(args);
        InitParameterInteraction(args);
        if (!AppInitBasicSetup(args, node.exit_status)) {
            // InitError will have been called with detailed error, which ends up on console
            return false;
        }
        if (!AppInitParameterInteraction(args)) {
            // InitError will have been called with detailed error, which ends up on console
            return false;
        }

        node.warnings = std::make_unique<node::Warnings>();

        node.kernel = std::make_unique<kernel::Context>();
        node.ecc_context = std::make_unique<ECC_Context>();
        if (!AppInitSanityChecks(*node.kernel))
        {
            // InitError will have been called with detailed error, which ends up on console
            return false;
        }

        if (args.GetBoolArg("-daemon", DEFAULT_DAEMON) || args.GetBoolArg("-daemonwait", DEFAULT_DAEMONWAIT)) {
#if HAVE_DECL_FORK
            tfm::format(std::cout, PACKAGE_NAME " starting\n");

            // Daemonize
            switch (fork_daemon(1, 0, daemon_ep)) { // don't chdir (1), do close FDs (0)
            case 0: // Child: continue.
                // If -daemonwait is not enabled, immediately send a success token the parent.
                if (!args.GetBoolArg("-daemonwait", DEFAULT_DAEMONWAIT)) {
                    daemon_ep.TokenWrite(1);
                    daemon_ep.Close();
                }
                break;
            case -1: // Error happened.
                return InitError(Untranslated(strprintf("fork_daemon() failed: %s", SysErrorString(errno))));
            default: { // Parent: wait and exit.
                int token = daemon_ep.TokenRead();
                if (token) { // Success
                    exit(EXIT_SUCCESS);
                } else { // fRet = false or token read error (premature exit).
                    tfm::format(std::cerr, "Error during initialization - check debug.log for details\n");
                    exit(EXIT_FAILURE);
                }
            }
            }
#else
            return InitError(Untranslated("-daemon is not supported on this operating system"));
#endif // HAVE_DECL_FORK
        }
        // Lock data directory after daemonization
        if (!AppInitLockDataDirectory())
        {
            // If locking the data directory failed, exit immediately
            return false;
        }
        fRet = AppInitInterfaces(node) && AppInitMain(node);
    }
    catch (const std::exception& e) {
        PrintExceptionContinue(&e, "AppInit()");
    } catch (...) {
        PrintExceptionContinue(nullptr, "AppInit()");
    }

#if HAVE_DECL_FORK
    if (daemon_ep.IsOpen()) {
        // Signal initialization status to parent, then close pipe.
        daemon_ep.TokenWrite(fRet);
        daemon_ep.Close();
    }
#endif
    return fRet;
}